

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O3

void Smt_PrsReadLines(Smt_Prs_t *p)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pLim;
  long lVar6;
  byte *pStr;
  ulong uVar7;
  
  if ((p->vStack).nSize != 0) {
    __assert_fail("Vec_IntSize(&p->vStack) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                  ,0x322,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  if ((p->vObjs).nSize != 0) {
    __assert_fail("Vec_WecSize(&p->vObjs) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                  ,0x324,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  Vec_IntPush(&p->vStack,0);
  Vec_WecPushLevel(&p->vObjs);
  pStr = (byte *)p->pBuffer;
  pbVar4 = (byte *)p->pLimit;
  p->pCur = (char *)pStr;
  pbVar5 = pStr;
  if (pStr < pbVar4) {
LAB_002fdd18:
    do {
      pbVar5 = pbVar5 + 1;
      uVar7 = (ulong)*pStr;
      if (uVar7 < 0x2a) {
        if ((0x100002600U >> (uVar7 & 0x3f) & 1) != 0) {
          pStr = pStr + 1;
          p->pCur = (char *)pStr;
          goto LAB_002fdd18;
        }
        if (uVar7 == 0x28) {
          lVar6 = (long)(p->vStack).nSize;
          if (lVar6 < 1) goto LAB_002fde7c;
          iVar3 = (p->vStack).pArray[lVar6 + -1];
          if (((long)iVar3 < 0) || (iVar2 = (p->vObjs).nSize, iVar2 <= iVar3)) goto LAB_002fde5d;
          Vec_IntPush((p->vObjs).pArray + iVar3,iVar2 * 2);
          Vec_IntPush(&p->vStack,(p->vObjs).nSize);
          Vec_WecPushLevel(&p->vObjs);
        }
        else {
          if (uVar7 != 0x29) goto LAB_002fdd54;
          iVar3 = (p->vStack).nSize;
          if (iVar3 < 1) {
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x396,"int Vec_IntPop(Vec_Int_t *)");
          }
          (p->vStack).nSize = iVar3 + -1;
        }
      }
      else {
LAB_002fdd54:
        pLim = pStr;
        if (pStr < pbVar4) {
          while ((0x29 < (byte)uVar7 || ((0x30100002600U >> (uVar7 & 0x3f) & 1) == 0))) {
            p->pCur = (char *)pbVar5;
            pLim = pbVar5;
            if (pbVar5 == pbVar4) goto LAB_002fddd1;
            bVar1 = *pbVar5;
            pbVar5 = pbVar5 + 1;
            uVar7 = (ulong)bVar1;
          }
          pLim = pbVar5 + -1;
        }
LAB_002fddd1:
        if (pLim < pbVar4) {
          p->pCur = (char *)(pLim + -1);
          iVar3 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pStr,(char *)pLim,(int *)0x0);
          lVar6 = (long)(p->vStack).nSize;
          if (lVar6 < 1) {
LAB_002fde7c:
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1f8,"int Vec_IntEntryLast(Vec_Int_t *)");
          }
          iVar2 = (p->vStack).pArray[lVar6 + -1];
          if (((long)iVar2 < 0) || ((p->vObjs).nSize <= iVar2)) {
LAB_002fde5d:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                          ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          if (iVar3 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10b,"int Abc_Var2Lit(int, int)");
          }
          Vec_IntPush((p->vObjs).pArray + iVar2,iVar3 * 2 + 1);
        }
      }
      pbVar4 = (byte *)p->pLimit;
      pStr = (byte *)(p->pCur + 1);
      p->pCur = (char *)pStr;
      pbVar5 = pStr;
    } while (pStr < pbVar4);
  }
  if ((p->vStack).nSize != 1) {
    __assert_fail("Vec_IntSize(&p->vStack) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                  ,0x34c,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  if ((p->vObjs).nSize != (p->vObjs).nCap) {
    __assert_fail("Vec_WecSize(&p->vObjs) == Vec_WecCap(&p->vObjs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                  ,0x34d,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  return;
}

Assistant:

void Smt_PrsReadLines( Smt_Prs_t * p )
{
    assert( Vec_IntSize(&p->vStack) == 0 );
    //assert( Vec_WecSize(&p->vDepth) == 0 );
    assert( Vec_WecSize(&p->vObjs) == 0 );
    // add top node at level 0
    //Vec_WecPushLevel( &p->vDepth );
    //Vec_WecPush( &p->vDepth, Vec_IntSize(&p->vStack), Vec_WecSize(&p->vObjs) );
    // add top node
    Vec_IntPush( &p->vStack, Vec_WecSize(&p->vObjs) );
    Vec_WecPushLevel( &p->vObjs );
    // add other nodes
    for ( p->pCur = p->pBuffer; p->pCur < p->pLimit; p->pCur++ )
    {
        Smt_PrsSkipSpaces( p );
        if ( *p->pCur == '(' )
        {
            // add new node at this depth
            //assert( Vec_WecSize(&p->vDepth) >= Vec_IntSize(&p->vStack) );
            //if ( Vec_WecSize(&p->vDepth) == Vec_IntSize(&p->vStack) )
            //    Vec_WecPushLevel(&p->vDepth);
            //Vec_WecPush( &p->vDepth, Vec_IntSize(&p->vStack), Vec_WecSize(&p->vObjs) );
            // add fanin to node on the previous level
            Vec_IntPush( Vec_WecEntry(&p->vObjs, Vec_IntEntryLast(&p->vStack)), Abc_Var2Lit(Vec_WecSize(&p->vObjs), 0) );            
            // add node to the stack
            Vec_IntPush( &p->vStack, Vec_WecSize(&p->vObjs) );
            Vec_WecPushLevel( &p->vObjs );
        }
        else if ( *p->pCur == ')' )
        {
            Vec_IntPop( &p->vStack );
        }
        else  // token
        {
            char * pStart = p->pCur; 
            Smt_PrsSkipNonSpaces( p );
            if ( p->pCur < p->pLimit )
            {
                // add fanin
                int iToken = Abc_NamStrFindOrAddLim( p->pStrs, pStart, p->pCur--, NULL );
                Vec_IntPush( Vec_WecEntry(&p->vObjs, Vec_IntEntryLast(&p->vStack)), Abc_Var2Lit(iToken, 1) );
            }
        }
    }
    assert( Vec_IntSize(&p->vStack) == 1 );
    assert( Vec_WecSize(&p->vObjs) == Vec_WecCap(&p->vObjs) );
}